

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O3

ChannelList *
anon_unknown.dwarf_30607d::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,PixelType *pt,
          FrameBuffer *buf,bool writing)

{
  int iVar1;
  char *pcVar2;
  Vec2<int> VVar3;
  Vec2<int> VVar4;
  uint uVar5;
  Box2i *pBVar6;
  long lVar7;
  _Rb_tree_header *extraout_RAX;
  _Rb_tree_header *p_Var8;
  undefined8 *puVar9;
  PixelType t;
  vector<char,_std::allocator<char>_> *this;
  uif *puVar10;
  long lVar11;
  void *ptr;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  int local_a8;
  int iStack_a0;
  Vec2<int> local_78;
  Vec2<int> VStack_70;
  Slice local_68;
  
  pBVar6 = Imf_2_5::Header::dataWindow(hdr);
  VVar3 = pBVar6->min;
  VVar4 = pBVar6->max;
  lVar12 = -1;
  lVar16 = 4;
  do {
    lVar16 = lVar16 + -4;
    lVar11 = lVar12 + 1;
    lVar12 = lVar12 + 1;
  } while (channels[lVar11] != (char *)0x0);
  local_78 = VVar3;
  VStack_70 = VVar4;
  pBVar6 = Imf_2_5::Header::dataWindow(hdr);
  iVar1 = (pBVar6->max).x;
  pBVar6 = Imf_2_5::Header::dataWindow(hdr);
  lVar15 = (long)((iVar1 - (pBVar6->min).x) + 1);
  pBVar6 = Imf_2_5::Header::dataWindow(hdr);
  iVar1 = (pBVar6->max).y;
  pBVar6 = Imf_2_5::Header::dataWindow(hdr);
  lVar13 = (long)((iVar1 - (pBVar6->min).y) + 1);
  lVar11 = lVar12 * lVar15 * lVar13;
  this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
  if (writing) {
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
  }
  std::vector<char,_std::allocator<char>_>::resize(this,lVar11 * 4);
  if (lVar11 != 0) {
    puVar10 = (uif *)(this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    lVar11 = 0;
    lVar14 = 0;
LAB_001ae8fb:
    do {
      uVar5 = random_int(0xffff);
      if ((~uVar5 & 0x7c00) == 0) {
        if ((uVar5 & 0x3ff) != 0) goto LAB_001ae8fb;
      }
      if ((pt == (PixelType *)0x0) || (pt[lVar11] == HALF)) {
        *(short *)puVar10 = (short)uVar5;
      }
      else {
        *puVar10 = half::_toFloat[uVar5 & 0xffff];
      }
      lVar7 = lVar12 - lVar11;
      lVar11 = lVar11 + 1;
      puVar10 = puVar10 + 1;
      if (lVar7 == 1) {
        lVar11 = 0;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar15 * lVar13 * lVar12);
  }
  p_Var8 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var8->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var8->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (lVar12 != 0) {
    local_a8 = VVar3.x;
    iStack_a0 = VVar4.x;
    lVar11 = (long)((iStack_a0 - local_a8) + 1);
    puVar9 = &(anonymous_namespace)::readingBuffer;
    if (writing) {
      puVar9 = &(anonymous_namespace)::writingBuffer;
    }
    ptr = (void *)*puVar9;
    lVar13 = 0;
    do {
      t = HALF;
      if (pt != (PixelType *)0x0) {
        t = pt[lVar13];
      }
      pcVar2 = channels[lVar13];
      Imf_2_5::Channel::Channel((Channel *)&local_68,t,1,1,false);
      Imf_2_5::ChannelList::insert(__return_storage_ptr__,pcVar2,(Channel *)&local_68);
      pcVar2 = channels[lVar13];
      auVar17._8_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar17._0_8_ = lVar13;
      auVar17._12_4_ = 0x45300000;
      Imf_2_5::Slice::Make
                (&local_68,t,ptr,&local_78,lVar11,1,-lVar16,-lVar16 * lVar11,1,1,
                 (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0) + 100.0,false,false
                );
      Imf_2_5::FrameBuffer::insert(buf,pcVar2,&local_68);
      ptr = (void *)((long)ptr + 4);
      lVar13 = lVar13 + 1;
      p_Var8 = extraout_RAX;
    } while (lVar12 != lVar13);
  }
  return (ChannelList *)p_Var8;
}

Assistant:

ChannelList
setupBuffer (const Header& hdr,       // header to grab datawindow from
             const char * const *channels, // NULL terminated list of channels to write
             const PixelType *pt,
             FrameBuffer& buf,        // buffer to fill with pointers to channel
             bool writing                  // true if should allocate
            )
{
    Box2i dw = hdr.dataWindow();

    //
    // how many channels in total
    //
    size_t activechans = 0;
    
    while (channels[activechans]!=NULL)
    {
        activechans++;
    }

    size_t samples = size_t(hdr.dataWindow().max.x+1-hdr.dataWindow().min.x)*
                  size_t(hdr.dataWindow().max.y+1-hdr.dataWindow().min.y)*activechans;

    // always allocate four bytes for each sample, even half types. to keep floats word-aligned
    size_t size =samples * 4;

    
    if (writing)
    {
        writingBuffer.resize(size);
    }
    else
    {
        readingBuffer.resize(size);
    }
   
     const char * write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
     // fill with random halfs, casting to floats for float channels - don't write NaN values
     size_t chan=0;
     for (size_t i=0;i<samples;i++)
     {

         half v;
         do
         {
           unsigned short int values = random_int(std::numeric_limits<unsigned short>::max());
           v.setBits(values);
         }
         while ( v.isNan() );

         if (pt==NULL || pt[chan]==IMF::HALF)
         {
             *(half*)write_ptr = half(v);
         }
         else
         {
             *(float*)write_ptr = float(v);
         }
         chan++;
         write_ptr += 4;
         if (chan==activechans)
         {
             chan=0;
         }
        
     }

     

    ChannelList chanlist;

    int64_t width = (dw.max.x+1-dw.min.x);
    int64_t bytes_per_row = activechans * 4 * width;
   
    const char* offset = ( writing ? writingBuffer.data() : readingBuffer.data() ); 
    for (size_t i=0;i<activechans;i++)
    {
        PixelType type = pt==NULL ? IMF::HALF : pt[i];

        chanlist.insert(channels[i],type);
        buf.insert (channels[i],
                    Slice::Make (type,
                                 offset,
                                 dw.min,
                                 width,1,
                                 activechans * 4,
                                 bytes_per_row,
                                 1,
                                 1,
                                 100.+i,false,false
                                )
                    );
        offset += 4;
   }

    return chanlist;
}